

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void ge_equals_ge(secp256k1_ge *a,secp256k1_ge *b)

{
  int iVar1;
  secp256k1_ge *psVar2;
  secp256k1_ge *bytes;
  uint64_t local_48;
  uint64_t uStack_40;
  uint64_t local_38;
  uint64_t uStack_30;
  uint64_t local_28;
  
  psVar2 = (secp256k1_ge *)&stack0xffffffffffffffb8;
  bytes = (secp256k1_ge *)&stack0xffffffffffffffb8;
  if (a->infinity == b->infinity) {
    if (a->infinity != 0) {
      return;
    }
    local_48 = ((b->x).n[0] - (a->x).n[0]) + 0x3ffffbfffff0bc;
    uStack_40 = ((b->x).n[1] - (a->x).n[1]) + 0x3ffffffffffffc;
    local_38 = ((b->x).n[2] - (a->x).n[2]) + 0x3ffffffffffffc;
    uStack_30 = ((b->x).n[3] - (a->x).n[3]) + 0x3ffffffffffffc;
    local_28 = ((b->x).n[4] - (a->x).n[4]) + 0x3fffffffffffc;
    iVar1 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)&stack0xffffffffffffffb8);
    if (iVar1 != 0) {
      local_48 = ((b->y).n[0] - (a->y).n[0]) + 0x3ffffbfffff0bc;
      uStack_40 = ((b->y).n[1] - (a->y).n[1]) + 0x3ffffffffffffc;
      local_38 = ((b->y).n[2] - (a->y).n[2]) + 0x3ffffffffffffc;
      uStack_30 = ((b->y).n[3] - (a->y).n[3]) + 0x3ffffffffffffc;
      local_28 = ((b->y).n[4] - (a->y).n[4]) + 0x3fffffffffffc;
      iVar1 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)&stack0xffffffffffffffb8);
      if (iVar1 != 0) {
        return;
      }
      goto LAB_00125a50;
    }
  }
  else {
    ge_equals_ge_cold_1();
    psVar2 = a;
  }
  bytes = psVar2;
  ge_equals_ge_cold_3();
LAB_00125a50:
  ge_equals_ge_cold_2();
  secp256k1_testrand_bytes_test((uchar *)bytes,0x20);
  return;
}

Assistant:

static void ge_equals_ge(const secp256k1_ge *a, const secp256k1_ge *b) {
    CHECK(a->infinity == b->infinity);
    if (a->infinity) {
        return;
    }
    CHECK(secp256k1_fe_equal_var(&a->x, &b->x));
    CHECK(secp256k1_fe_equal_var(&a->y, &b->y));
}